

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_plane.cpp
# Opt level: O2

vec3 __thiscall polyscope::SlicePlane::getNormal(SlicePlane *this)

{
  ulong uVar1;
  vec<3,_float,_(glm::qualifier)0> vVar2;
  vec3 vVar3;
  vec<3,_float,_(glm::qualifier)0> local_10;
  undefined8 uVar4;
  
  if ((this->active).value == true) {
    local_10.field_2 =
         *(anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)
          &(this->objectTransform).value.value[0].field_2;
    local_10.field_0 =
         *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)
          &(this->objectTransform).value.value[0].field_0;
    local_10.field_1 =
         *(anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 *)
          &(this->objectTransform).value.value[0].field_1;
    vVar2 = glm::detail::compute_normalize<3,_float,_(glm::qualifier)0,_false>::call(&local_10);
  }
  else {
    uVar1 = SUB648(ZEXT464(0xbf800000),0);
    vVar2.field_2.z = 0.0;
    vVar2.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)uVar1;
    vVar2.field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)(int)(uVar1 >> 0x20);
    vmovlps_avx(SUB6416(ZEXT464(0xbf800000),0));
  }
  vVar3.field_0 = vVar2.field_0;
  uVar4._4_4_ = vVar2.field_1;
  vVar3.field_2 = vVar2.field_2;
  return vVar3;
}

Assistant:

glm::vec3 SlicePlane::getNormal() {
  if (active.get()) {
    glm::vec3 normal{objectTransform.get()[0][0], objectTransform.get()[0][1], objectTransform.get()[0][2]};
    normal = glm::normalize(normal);
    return normal;
  } else {
    // Matched with center so tests always pass when disabled
    return glm::vec3{-1., 0., 0.};
  }
}